

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

char * Aig_TimeStamp(void)

{
  tm *__tp;
  char *__s;
  size_t sVar1;
  time_t ltime;
  time_t tStack_18;
  
  time(&tStack_18);
  __tp = localtime(&tStack_18);
  __s = asctime(__tp);
  sVar1 = strlen(__s);
  __s[sVar1 - 1] = '\0';
  strcpy(Aig_TimeStamp::Buffer,__s);
  return Aig_TimeStamp::Buffer;
}

Assistant:

char * Aig_TimeStamp()
{
    static char Buffer[100];
	char * TimeStamp;
	time_t ltime;
    // get the current time
	time( &ltime );
	TimeStamp = asctime( localtime( &ltime ) );
	TimeStamp[ strlen(TimeStamp) - 1 ] = 0;
    strcpy( Buffer, TimeStamp );
    return Buffer;
}